

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChAssembly.cpp
# Opt level: O2

void __thiscall chrono::ChAssembly::Remove(ChAssembly *this,shared_ptr<chrono::ChPhysicsItem> *item)

{
  __shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2> *p_Var1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *this_00;
  shared_ptr<chrono::ChBody> body;
  __shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2> local_78;
  __shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2> local_68;
  __shared_ptr<chrono::fea::ChMesh,_(__gnu_cxx::_Lock_policy)2> local_58;
  __shared_ptr<chrono::ChLinkBase,_(__gnu_cxx::_Lock_policy)2> local_48;
  __shared_ptr<chrono::ChShaft,_(__gnu_cxx::_Lock_policy)2> local_38;
  __shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2> local_28;
  
  std::dynamic_pointer_cast<chrono::ChBody,chrono::ChPhysicsItem>
            ((shared_ptr<chrono::ChPhysicsItem> *)&local_78);
  if (local_78._M_ptr == (element_type *)0x0) {
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_78._M_refcount);
    std::dynamic_pointer_cast<chrono::ChShaft,chrono::ChPhysicsItem>
              ((shared_ptr<chrono::ChPhysicsItem> *)&local_78);
    if (local_78._M_ptr == (element_type *)0x0) {
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_78._M_refcount);
      std::dynamic_pointer_cast<chrono::ChLinkBase,chrono::ChPhysicsItem>
                ((shared_ptr<chrono::ChPhysicsItem> *)&local_78);
      if (local_78._M_ptr == (element_type *)0x0) {
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_78._M_refcount);
        std::dynamic_pointer_cast<chrono::fea::ChMesh,chrono::ChPhysicsItem>
                  ((shared_ptr<chrono::ChPhysicsItem> *)&local_78);
        if (local_78._M_ptr == (element_type *)0x0) {
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_78._M_refcount);
          std::__shared_ptr<chrono::ChPhysicsItem,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                    ((__shared_ptr<chrono::ChPhysicsItem,_(__gnu_cxx::_Lock_policy)2> *)&local_68,
                     &item->super___shared_ptr<chrono::ChPhysicsItem,_(__gnu_cxx::_Lock_policy)2>);
          RemoveOtherPhysicsItem(this,(shared_ptr<chrono::ChPhysicsItem> *)&local_68);
          p_Var1 = &local_68;
          goto LAB_00a86b67;
        }
        std::__shared_ptr<chrono::fea::ChMesh,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                  (&local_58,
                   (__shared_ptr<chrono::fea::ChMesh,_(__gnu_cxx::_Lock_policy)2> *)&local_78);
        RemoveMesh(this,(shared_ptr<chrono::fea::ChMesh> *)&local_58);
        this_00 = &local_58._M_refcount;
      }
      else {
        std::__shared_ptr<chrono::ChLinkBase,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                  (&local_48,
                   (__shared_ptr<chrono::ChLinkBase,_(__gnu_cxx::_Lock_policy)2> *)&local_78);
        RemoveLink(this,(shared_ptr<chrono::ChLinkBase> *)&local_48);
        this_00 = &local_48._M_refcount;
      }
    }
    else {
      std::__shared_ptr<chrono::ChShaft,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&local_38,(__shared_ptr<chrono::ChShaft,_(__gnu_cxx::_Lock_policy)2> *)&local_78);
      RemoveShaft(this,(shared_ptr<chrono::ChShaft> *)&local_38);
      this_00 = &local_38._M_refcount;
    }
  }
  else {
    std::__shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr(&local_28,&local_78)
    ;
    RemoveBody(this,(shared_ptr<chrono::ChBody> *)&local_28);
    this_00 = &local_28._M_refcount;
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(this_00);
  p_Var1 = &local_78;
LAB_00a86b67:
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&p_Var1->_M_refcount);
  return;
}

Assistant:

void ChAssembly::Remove(std::shared_ptr<ChPhysicsItem> item) {
    if (auto body = std::dynamic_pointer_cast<ChBody>(item)) {
        RemoveBody(body);
        return;
    }

    if (auto shaft = std::dynamic_pointer_cast<ChShaft>(item)) {
        RemoveShaft(shaft);
        return;
    }

    if (auto link = std::dynamic_pointer_cast<ChLinkBase>(item)) {
        RemoveLink(link);
        return;
    }

    if (auto mesh = std::dynamic_pointer_cast<fea::ChMesh>(item)) {
        RemoveMesh(mesh);
        return;
    }

    RemoveOtherPhysicsItem(item);
}